

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

string * Utility::binary_to_hex(string *__return_storage_ptr__,string *bin_input)

{
  ulong uVar1;
  ulong uVar2;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  while (uVar1 = bin_input->_M_string_length, (uVar1 & 3) != 0) {
    std::operator+(&local_50,'0',bin_input);
    std::__cxx11::string::operator=((string *)bin_input,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 4) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)bin_input);
    four_bits_to_hex(&local_70);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    uVar1 = bin_input->_M_string_length;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Utility::binary_to_hex(std::string bin_input) {
    std::string output = "";

    while (bin_input.length() % 4 != 0)bin_input = '0' + bin_input;
    for (int i = 0; i < bin_input.length(); i = i + 4) {
        output += four_bits_to_hex(bin_input.substr(i, 4));
    }
    return output;
}